

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

xmlChar * htmlFindEntityPrefix(xmlChar *string,size_t slen,int isAttr,int *nlen,int *rlen)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  ulong local_78;
  byte *local_70;
  
  if ((1 < slen) && ((*string | 0x20) - 0x61 < 0x1a)) {
    lVar2 = (ulong)(*string & 0x3f) * 3;
    if (""[lVar2 + 2] != 0) {
      uVar8 = (uint)*(ushort *)("" + lVar2);
      uVar11 = (uint)""[lVar2 + 2] + (uint)*(ushort *)("" + lVar2);
      uVar10 = 1;
      local_70 = (byte *)0x0;
      local_78 = 0;
      do {
        uVar7 = (uVar11 - uVar8 >> 1) + uVar8;
        uVar5 = (ulong)htmlEntValues[uVar7];
        bVar1 = htmlEntStrings[uVar5];
        uVar9 = (ulong)(bVar1 & 0x3f);
        iVar3 = (uint)string[uVar10] - (uint)htmlEntStrings[uVar5 + 1];
        if (iVar3 == 0) {
          if (slen < uVar9) {
            iVar3 = strncmp((char *)(string + uVar10 + 1),(char *)(htmlEntStrings + uVar5 + 2),
                            slen - 1);
            if (iVar3 == 0) break;
          }
          else {
            iVar3 = strncmp((char *)(string + uVar10 + 1),(char *)(htmlEntStrings + uVar5 + 2),
                            uVar9 - 1);
          }
        }
        if (-1 < iVar3) {
          if (iVar3 == 0) {
            uVar10 = uVar10 + uVar9;
            uVar8 = 0;
            if ((uVar10 < slen) && (uVar8 = (uint)string[uVar10], (uVar8 | 0x20) - 0x61 < 0x1a)) {
              bVar12 = false;
            }
            else {
              bVar12 = uVar8 - 0x3a < 0xfffffff6;
            }
            if (uVar8 == 0x3b) {
LAB_0016a2b1:
              local_70 = htmlEntStrings + uVar9 + uVar5 + 1;
              local_78 = (uVar8 == 0x3b) + uVar10;
              uVar6 = 2;
            }
            else if ((char)bVar1 < '\0') {
              if (isAttr == 0) goto LAB_0016a2b1;
              bVar4 = uVar8 != 0x3d & bVar12;
              if (bVar4 != 0) {
                local_70 = htmlEntStrings + uVar9 + uVar5 + 1;
                local_78 = uVar10;
              }
              uVar6 = (ulong)((uint)bVar4 * 2);
            }
            else {
              uVar6 = 0;
            }
            if (((bVar1 & 0x40) == 0) ||
               (local_70 = local_70 + uVar6, slen <= uVar10 || bVar12 != false)) break;
            uVar8 = uVar7 + htmlEntStrings[uVar9 + uVar5 + 1];
            uVar7 = htmlEntStrings[uVar9 + uVar5 + 2] + uVar8;
          }
          else {
            uVar8 = uVar7 + 1;
            uVar7 = uVar11;
          }
        }
        uVar11 = uVar7;
      } while (uVar8 < uVar11);
      if (local_70 != (byte *)0x0) {
        *nlen = (int)local_78;
        *rlen = (uint)*local_70;
        return local_70 + 1;
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
htmlFindEntityPrefix(const xmlChar *string, size_t slen, int isAttr,
                     int *nlen, int *rlen) {
    const xmlChar *match = NULL;
    unsigned left, right;
    int first = string[0];
    size_t matchLen = 0;
    size_t soff = 1;

    if (slen < 2)
        return(NULL);
    if (!IS_ASCII_LETTER(first))
        return(NULL);

    /*
     * Look up range by first character
     */
    first &= 63;
    left = htmlEntAlpha[first*3] | htmlEntAlpha[first*3+1] << 8;
    right = left + htmlEntAlpha[first*3+2];

    /*
     * Binary search
     */
    while (left < right) {
        const xmlChar *bytes;
        unsigned mid;
        size_t len;
        int cmp;

        mid = left + (right - left) / 2;
        bytes = htmlEntStrings + htmlEntValues[mid];
        len = bytes[0] & ~ENT_F_ALL;

        cmp = string[soff] - bytes[1];

        if (cmp == 0) {
            if (slen < len) {
                cmp = strncmp((const char *) string + soff + 1,
                              (const char *) bytes + 2,
                              slen - 1);
                /* Prefix can never match */
                if (cmp == 0)
                    break;
            } else {
                cmp = strncmp((const char *) string + soff + 1,
                              (const char *) bytes + 2,
                              len - 1);
            }
        }

        if (cmp < 0) {
            right = mid;
        } else if (cmp > 0) {
            left = mid + 1;
        } else {
            int term = soff + len < slen ? string[soff + len] : 0;
            int isAlnum, isTerm;

            isAlnum = IS_ALNUM(term);
            isTerm = ((term == ';') ||
                      ((bytes[0] & ENT_F_SEMICOLON) &&
                       ((!isAttr) ||
                        ((!isAlnum) && (term != '=')))));

            if (isTerm) {
                match = bytes + len + 1;
                matchLen = soff + len;
                if (term == ';')
                    matchLen += 1;
            }

            if (bytes[0] & ENT_F_SUBTABLE) {
                if (isTerm)
                    match += 2;

                if ((isAlnum) && (soff + len < slen)) {
                    left = mid + bytes[len + 1];
                    right = left + bytes[len + 2];
                    soff += len;
                    continue;
                }
            }

            break;
        }
    }

    if (match == NULL)
        return(NULL);

    *nlen = matchLen;
    *rlen = match[0];
    return(match + 1);
}